

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

void __thiscall
AlignmentRecord::mergeAlignmentRecordsMixed(AlignmentRecord *this,AlignmentRecord *ar)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  shared_count sVar6;
  uint *puVar7;
  size_t sVar8;
  reference pcVar9;
  string *qualities_00;
  AlignmentRecord *in_RSI;
  long in_RDI;
  char i_3;
  iterator __end7;
  iterator __begin7;
  string *__range7;
  char i_2;
  iterator __end6_1;
  iterator __begin6_1;
  string *__range6_1;
  int ref_rel_pos2_1;
  int ref_rel_pos1_1;
  int c_p_pos2_1;
  int c_p_pos1_1;
  int c_pos1_1;
  int q_p_pos2_1;
  int q_p_pos1_1;
  int q_pos1_1;
  int ref_p_e_pos2_1;
  int ref_p_s_pos1_1;
  int ref_e_pos1_1;
  int ref_s_pos1_1;
  int offset_p_b2_1;
  int offset_p_b1_1;
  int offset_p_f2_1;
  int offset_p_f1_1;
  int offset_s_b_1;
  int offset_s_f_1;
  string algn_1;
  string ref_1;
  string nucigar_1;
  string qualities_1;
  string dna_1;
  char i_1;
  iterator __end6;
  iterator __begin6;
  string *__range6;
  char i;
  iterator __end5;
  iterator __begin5;
  string *__range5;
  int ref_rel_pos2;
  int ref_rel_pos1;
  int c_p_pos2;
  int c_p_pos1;
  int c_pos1;
  int q_p_pos2;
  int q_p_pos1;
  int q_pos1;
  int ref_p_e_pos2;
  int ref_p_s_pos2;
  int ref_p_e_pos1;
  int ref_p_s_pos1;
  int ref_e_pos1;
  int ref_s_pos1;
  int offset_p_b2;
  int offset_p_b1;
  int offset_p_f2;
  int offset_p_f1;
  int offset_s_b;
  int offset_s_f;
  string algn;
  string ref;
  string nucigar;
  string qualities;
  string dna;
  AlignmentRecord *in_stack_fffffffffffff728;
  ShortDnaSequence *in_stack_fffffffffffff730;
  undefined8 in_stack_fffffffffffff738;
  undefined8 in_stack_fffffffffffff740;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff748;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff750;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff780;
  string *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  shared_count in_stack_fffffffffffff7d0;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  undefined1 uVar10;
  string *in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e8;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff7ec;
  undefined8 in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f8;
  uint in_stack_fffffffffffff7fc;
  AlignmentRecord *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff810;
  string *in_stack_fffffffffffff818;
  ShortDnaSequence *in_stack_fffffffffffff820;
  int *in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  string *in_stack_fffffffffffff848;
  shared_count in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  shared_count in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  shared_count in_stack_fffffffffffff870;
  shared_count in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  pointer in_stack_fffffffffffff890;
  mapValue *pmVar12;
  pointer in_stack_fffffffffffff898;
  int *in_stack_fffffffffffff8a0;
  alignment_id_t in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  undefined4 in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b4;
  undefined8 in_stack_fffffffffffff8b8;
  _Base_ptr in_stack_fffffffffffff8c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  undefined1 *local_510;
  uint local_4a8;
  uint local_4a4;
  undefined8 local_4a0;
  undefined8 local_498;
  char local_489;
  undefined8 local_488;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  undefined1 *local_478;
  uint local_410;
  uint local_40c [7];
  mapValue local_3f0;
  mapValue local_3d0 [2];
  string local_398 [32];
  string local_378 [36];
  undefined1 local_354 [8];
  undefined1 local_34c [8];
  undefined1 local_344 [12];
  undefined1 local_338 [8];
  undefined1 local_330 [8];
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> local_328;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  shared_count in_stack_fffffffffffffcf8;
  AlignmentRecord *in_stack_fffffffffffffd00;
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  undefined1 local_2b8 [64];
  string local_278 [40];
  _func_int **local_250;
  char local_241;
  shared_count local_240;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  shared_count local_230;
  uint local_1c8;
  uint local_1c4;
  _Rb_tree_impl<std::less<int>,_true> local_1c0 [3];
  uint local_12c;
  _Rb_tree_color local_128;
  undefined1 local_124 [8];
  undefined1 local_11c [4];
  undefined1 local_118 [4];
  undefined1 local_114 [8];
  undefined1 local_10c [4];
  undefined1 local_108 [12];
  undefined1 local_fc [8];
  undefined1 local_f4 [16];
  int local_e4;
  int local_e0;
  undefined1 local_dc [12];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  undefined1 local_70 [64];
  string local_30 [32];
  AlignmentRecord *local_10;
  
  local_10 = in_RSI;
  bVar1 = isSingleEnd(in_RSI);
  if (bVar1) {
    std::__cxx11::string::string(local_30);
    std::__cxx11::string::string((string *)(local_70 + 0x20));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_70,"",&local_71);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",(allocator *)((long)local_dc + 0xb));
    std::allocator<char>::~allocator((allocator<char> *)((long)local_dc + 0xb));
    local_f4._8_4_ = 0;
    getCigar1Unrolled(local_10);
    local_dc._4_4_ =
         computeOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current);
    getCigar1Unrolled(local_10);
    local_dc._0_4_ = computeRevOffset(in_stack_fffffffffffff780);
    local_e0 = computeOffset((vector<char,_std::allocator<char>_> *)
                             in_stack_fffffffffffff750._M_current);
    local_e4 = computeOffset((vector<char,_std::allocator<char>_> *)
                             in_stack_fffffffffffff750._M_current);
    local_f4._12_4_ = computeRevOffset(in_stack_fffffffffffff780);
    local_f4._8_4_ = computeRevOffset(in_stack_fffffffffffff780);
    local_f4._4_4_ = getStart1(local_10);
    local_f4._4_4_ = local_f4._4_4_ - local_dc._4_4_;
    uVar3 = getEnd1(local_10);
    local_f4._0_4_ = uVar3 + local_dc._0_4_;
    local_fc._4_4_ = *(int *)(in_RDI + 0x24) - local_e0;
    local_fc._0_4_ = *(int *)(in_RDI + 0x28) + local_f4._12_4_;
    local_108._8_4_ = *(int *)(in_RDI + 0xd4) - local_e4;
    local_108._4_4_ = *(int *)(in_RDI + 0xd8) + local_f4._8_4_;
    local_108._0_4_ = 0;
    local_10c = (undefined1  [4])0x0;
    local_114._4_4_ = 0;
    local_114._0_4_ = 0;
    local_118 = (undefined1  [4])0x0;
    local_11c = (undefined1  [4])0x0;
    local_124._4_4_ = 0;
    local_124._0_4_ = 0;
    uVar3 = getEnd1(local_10);
    if (uVar3 < *(uint *)(in_RDI + 0xd4)) {
      mergeAlignmentRecordsSingle
                (in_stack_fffffffffffffd00,(AlignmentRecord *)in_stack_fffffffffffffcf8.pi_,
                 in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
      *(undefined1 *)(in_RDI + 0x184) = 0;
    }
    else {
      uVar3 = getStart1(local_10);
      if (*(uint *)(in_RDI + 0x28) < uVar3) {
        mergeAlignmentRecordsSingle
                  (in_stack_fffffffffffffd00,(AlignmentRecord *)in_stack_fffffffffffffcf8.pi_,
                   in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0);
      }
      else if ((int)local_fc._4_4_ < (int)local_f4._4_4_) {
        if ((int)local_fc._4_4_ <= (int)local_f4._4_4_) {
          while ((int)local_fc._4_4_ < (int)local_f4._4_4_) {
            in_stack_fffffffffffff740 = local_124 + 4;
            in_stack_fffffffffffff738 = local_fc + 4;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_10c;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_118;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          local_124._0_4_ = local_124._4_4_;
          while ((uint)local_fc._4_4_ <= *(uint *)(in_RDI + 0x28)) {
            in_stack_fffffffffffff750._M_current = local_fc + 4;
            in_stack_fffffffffffff748._M_current = local_108;
            in_stack_fffffffffffff740 = local_10c;
            in_stack_fffffffffffff738 = local_114;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_118;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_70;
            overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                         (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                         (string *)in_stack_fffffffffffff860.pi_,
                         (AlignmentRecord *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                         (string *)in_stack_fffffffffffff880.pi_,
                         (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                         in_stack_fffffffffffff8a0,
                         (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                         (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                         (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
          }
          local_124._0_4_ = local_124._4_4_ - local_124._0_4_;
          while ((uint)local_fc._4_4_ < *(uint *)(in_RDI + 0xd4)) {
            in_stack_fffffffffffff740 = local_124;
            in_stack_fffffffffffff738 = local_fc + 4;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_108;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_114;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          local_124._4_4_ = 0;
          computeSOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current
                         ,(int *)in_stack_fffffffffffff748._M_current,
                         (int *)in_stack_fffffffffffff740);
          while ((int)local_fc._4_4_ <= (int)local_108._4_4_ &&
                 (int)local_fc._4_4_ <= (int)local_f4._0_4_) {
            in_stack_fffffffffffff750._M_current = local_fc + 4;
            in_stack_fffffffffffff748._M_current = local_108;
            in_stack_fffffffffffff740 = local_114 + 4;
            in_stack_fffffffffffff738 = local_114;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_11c;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_70;
            overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                         (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                         (string *)in_stack_fffffffffffff860.pi_,
                         (AlignmentRecord *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                         (string *)in_stack_fffffffffffff880.pi_,
                         (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                         &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                         in_stack_fffffffffffff8a0,
                         (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                         (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                         (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
          }
          local_124._0_4_ = local_124._4_4_ + -1 + local_124._0_4_;
          if (local_fc._4_4_ - 1 == local_108._4_4_) {
            while ((int)local_fc._4_4_ <= (int)local_f4._0_4_) {
              in_stack_fffffffffffff740 = local_124;
              in_stack_fffffffffffff738 = local_fc + 4;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)local_108;
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_114;
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
              noOverlapMerge(in_stack_fffffffffffff800,
                             (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)
                             ,(string *)in_stack_fffffffffffff7f0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                             ,in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                            (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                            (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                            (int)in_stack_fffffffffffff7e0);
          }
          else if (local_fc._4_4_ - 1 == local_f4._0_4_) {
            while ((int)local_fc._4_4_ <= (int)local_108._4_4_) {
              in_stack_fffffffffffff740 = local_124 + 4;
              in_stack_fffffffffffff738 = local_fc + 4;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)(local_114 + 4);
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_11c;
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),2);
              noOverlapMerge(in_stack_fffffffffffff800,
                             (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)
                             ,(string *)in_stack_fffffffffffff7f0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                             ,in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                            (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                            (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                            (int)in_stack_fffffffffffff7e0);
          }
          local_1c4 = getStart1(local_10);
          puVar7 = std::min<unsigned_int>((uint *)(in_RDI + 0x24),&local_1c4);
          *(uint *)(in_RDI + 0x24) = *puVar7;
          local_1c8 = getEnd1(local_10);
          puVar7 = std::max<unsigned_int>(&local_1c8,(uint *)(in_RDI + 0xd8));
          *(uint *)(in_RDI + 0x28) = *puVar7;
          *(undefined1 *)(in_RDI + 0x184) = 1;
          createCigar(in_stack_fffffffffffff798);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff740,
                     (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff738);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff740);
          ShortDnaSequence::ShortDnaSequence
                    (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
          ShortDnaSequence::operator=
                    (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
          ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff730);
          iVar2 = phred_sum((string *)in_stack_fffffffffffff740,
                            (char)((ulong)in_stack_fffffffffffff738 >> 0x38));
          *(int *)(in_RDI + 0x20) = iVar2;
          sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28e28f);
          *(int *)(in_RDI + 0x60) = (int)sVar8;
          sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28e2b5);
          *(int *)(in_RDI + 100) = (int)sVar8;
          std::vector<char,_std::allocator<char>_>::clear
                    ((vector<char,_std::allocator<char>_> *)0x28e2db);
          local_230.pi_ = (sp_counted_base *)local_70;
          local_238._M_current = (char *)std::__cxx11::string::begin();
          local_240.pi_ = (sp_counted_base *)std::__cxx11::string::end();
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffff730,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffff728), bVar1) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_238);
            local_241 = *pcVar9;
            std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff740,
                       (value_type *)in_stack_fffffffffffff738);
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_238);
          }
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),local_a8);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x220),local_d0);
          local_250 = (_func_int **)std::__cxx11::string::begin();
          local_278._32_8_ = std::__cxx11::string::end();
          std::vector<int,std::allocator<int>>::
          assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                     in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        }
      }
      else {
        while ((int)local_f4._4_4_ < (int)local_fc._4_4_) {
          in_stack_fffffffffffff740 = local_124;
          in_stack_fffffffffffff738 = (long)local_f4 + 4;
          in_stack_fffffffffffff730 = (ShortDnaSequence *)local_108;
          in_stack_fffffffffffff728 = (AlignmentRecord *)local_114;
          in_stack_fffffffffffff748._M_current =
               (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
          noOverlapMerge(in_stack_fffffffffffff800,
                         (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                         (string *)in_stack_fffffffffffff7f0,
                         (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                         in_stack_fffffffffffff7e0,
                         (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                         (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                         (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                         (int)in_stack_fffffffffffff830);
        }
        while ((uint)local_f4._4_4_ <= *(uint *)(in_RDI + 0x28)) {
          in_stack_fffffffffffff750._M_current = (char *)((long)local_f4 + 4);
          in_stack_fffffffffffff748._M_current = local_108;
          in_stack_fffffffffffff740 = local_10c;
          in_stack_fffffffffffff738 = local_114;
          in_stack_fffffffffffff730 = (ShortDnaSequence *)local_118;
          in_stack_fffffffffffff728 = (AlignmentRecord *)local_70;
          overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                       (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                       (string *)in_stack_fffffffffffff860.pi_,
                       (AlignmentRecord *)
                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                       (string *)in_stack_fffffffffffff880.pi_,
                       (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                       in_stack_fffffffffffff8a0,
                       (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                       (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                       (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
        }
        local_124._0_4_ = local_124._4_4_ + local_124._0_4_;
        while ((uint)local_f4._4_4_ < *(uint *)(in_RDI + 0xd4)) {
          in_stack_fffffffffffff740 = local_124;
          in_stack_fffffffffffff738 = (long)local_f4 + 4;
          in_stack_fffffffffffff730 = (ShortDnaSequence *)local_108;
          in_stack_fffffffffffff728 = (AlignmentRecord *)local_114;
          in_stack_fffffffffffff748._M_current =
               (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
          noOverlapMerge(in_stack_fffffffffffff800,
                         (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                         (string *)in_stack_fffffffffffff7f0,
                         (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                         in_stack_fffffffffffff7e0,
                         (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                         (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                         (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                         (int)in_stack_fffffffffffff830);
        }
        local_124._4_4_ = 0;
        computeSOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current,
                       (int *)in_stack_fffffffffffff748._M_current,(int *)in_stack_fffffffffffff740)
        ;
        while ((int)local_f4._4_4_ <= (int)local_108._4_4_ &&
               (int)local_f4._4_4_ <= (int)local_f4._0_4_) {
          in_stack_fffffffffffff750._M_current = (char *)((long)local_f4 + 4);
          in_stack_fffffffffffff748._M_current = local_108;
          in_stack_fffffffffffff740 = local_114 + 4;
          in_stack_fffffffffffff738 = local_114;
          in_stack_fffffffffffff730 = (ShortDnaSequence *)local_11c;
          in_stack_fffffffffffff728 = (AlignmentRecord *)local_70;
          overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                       (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                       (string *)in_stack_fffffffffffff860.pi_,
                       (AlignmentRecord *)
                       CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                       (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                       (string *)in_stack_fffffffffffff880.pi_,
                       (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                       in_stack_fffffffffffff8a0,
                       (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                       (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                       (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
        }
        local_124._0_4_ = local_124._4_4_ + local_124._0_4_;
        if (local_f4._4_4_ - 1 == local_108._4_4_) {
          while ((int)local_f4._4_4_ <= (int)local_f4._0_4_) {
            in_stack_fffffffffffff740 = local_124;
            in_stack_fffffffffffff738 = (long)local_f4 + 4;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_108;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_114;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                          (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                          (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                          (int)in_stack_fffffffffffff7e0);
        }
        else if (local_f4._4_4_ - 1 == local_f4._0_4_) {
          while ((int)local_f4._4_4_ <= (int)local_108._4_4_) {
            in_stack_fffffffffffff740 = local_124 + 4;
            in_stack_fffffffffffff738 = (long)local_f4 + 4;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)(local_114 + 4);
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_11c;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),2);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                          (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                          (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                          (int)in_stack_fffffffffffff7e0);
        }
        local_128 = getStart1(local_10);
        puVar7 = std::min<unsigned_int>((uint *)(in_RDI + 0x24),&local_128);
        *(uint *)(in_RDI + 0x24) = *puVar7;
        local_12c = getEnd1(local_10);
        puVar7 = std::max<unsigned_int>(&local_12c,(uint *)(in_RDI + 0xd8));
        *(uint *)(in_RDI + 0x28) = *puVar7;
        *(undefined1 *)(in_RDI + 0x184) = 1;
        createCigar(in_stack_fffffffffffff798);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   in_stack_fffffffffffff740,
                   (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   in_stack_fffffffffffff738);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   in_stack_fffffffffffff740);
        ShortDnaSequence::ShortDnaSequence
                  (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
        ShortDnaSequence::operator=
                  (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
        ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff730);
        iVar2 = phred_sum((string *)in_stack_fffffffffffff740,
                          (char)((ulong)in_stack_fffffffffffff738 >> 0x38));
        *(int *)(in_RDI + 0x20) = iVar2;
        sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28daa7);
        *(int *)(in_RDI + 0x60) = (int)sVar8;
        sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28dacd);
        *(int *)(in_RDI + 100) = (int)sVar8;
        std::vector<char,_std::allocator<char>_>::clear
                  ((vector<char,_std::allocator<char>_> *)0x28daf3);
        local_1c0[0].super__Rb_tree_header._M_node_count = (size_t)local_70;
        local_1c0[0].super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)std::__cxx11::string::begin();
        local_1c0[0].super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)std::__cxx11::string::end();
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff730,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff728), bVar1) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1c0[0].super__Rb_tree_header._M_header._M_right);
          local_1c0[0].super__Rb_tree_header._M_header._M_parent._7_1_ = *pcVar9;
          std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff740,
                     (value_type *)in_stack_fffffffffffff738);
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1c0[0].super__Rb_tree_header._M_header._M_right);
        }
        std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),local_a8);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x220),local_d0);
        local_1c0[0].super__Rb_tree_header._M_header._0_8_ = std::__cxx11::string::begin();
        local_1c0[0]._0_8_ = std::__cxx11::string::end();
        std::vector<int,std::allocator<int>>::
        assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                   in_stack_fffffffffffff750,in_stack_fffffffffffff748);
      }
    }
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    std::__cxx11::string::~string(local_30);
  }
  else {
    bVar1 = isPairedEnd(local_10);
    if (bVar1) {
      std::__cxx11::string::string(local_278);
      std::__cxx11::string::string((string *)(local_2b8 + 0x20));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2b8,"",&local_2b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e0,"",&local_2e1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffcf8,"",(allocator *)&stack0xfffffffffffffcf7);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcf7);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      iVar2 = computeOffset((vector<char,_std::allocator<char>_> *)
                            in_stack_fffffffffffff750._M_current);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = computeRevOffset(in_stack_fffffffffffff780);
      getCigar1Unrolled(local_10);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           computeOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current
                        );
      getCigar2Unrolled(local_10);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           computeOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current
                        );
      getCigar1Unrolled(local_10);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = computeRevOffset(in_stack_fffffffffffff780);
      getCigar2Unrolled(local_10);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = computeRevOffset(in_stack_fffffffffffff780);
      local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(int *)(in_RDI + 0x24) - iVar2;
      local_330._4_4_ =
           *(int *)(in_RDI + 0x28) +
           local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_330._0_4_ = getStart1(local_10);
      local_330._0_4_ =
           local_330._0_4_ -
           (int)local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar3 = getEnd2(local_10);
      local_338._4_4_ =
           uVar3 + local_328.
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start._4_4_;
      local_338._0_4_ = 0;
      local_344._8_4_ = 0;
      local_344._4_4_ = 0;
      local_344._0_4_ = 0;
      local_34c._4_4_ = 0;
      local_34c._0_4_ = 0;
      local_354._4_4_ = 0;
      local_354._0_4_ = 0;
      uVar3 = *(uint *)(in_RDI + 0x28);
      uVar4 = getStart2(local_10);
      if (uVar3 < uVar4) {
        mergeAlignmentRecordsSingle
                  (in_stack_fffffffffffffd00,(AlignmentRecord *)in_stack_fffffffffffffcf8.pi_,
                   in_stack_fffffffffffffcf4,iVar2);
        uVar3 = getStart2(local_10);
        *(uint *)(in_RDI + 0xd4) = uVar3;
        uVar3 = getEnd2(local_10);
        *(uint *)(in_RDI + 0xd8) = uVar3;
        *(undefined1 *)(in_RDI + 0x184) = 0;
        getCigar2(local_10);
        std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                  ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   in_stack_fffffffffffff7d0.pi_,
                   (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        getSequence2(local_10);
        ShortDnaSequence::operator=
                  (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
        iVar2 = getPhredSum2(local_10);
        *(int *)(in_RDI + 0xd0) = iVar2;
        iVar2 = getLengthInclDeletions2(local_10);
        *(int *)(in_RDI + 0x110) = iVar2;
        iVar2 = getLengthInclLongDeletions2(local_10);
        *(int *)(in_RDI + 0x114) = iVar2;
        getCigar2Unrolled(local_10);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff7d0.pi_,
                   (vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        getReferenceSeq2_abi_cxx11_(in_stack_fffffffffffff728);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x200),local_378);
        std::__cxx11::string::~string(local_378);
        getAlignSequence2_abi_cxx11_(in_stack_fffffffffffff728);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x240),local_398);
        std::__cxx11::string::~string(local_398);
        getQualityList2(in_stack_fffffffffffff728);
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff738);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740);
      }
      else {
        uVar3 = *(uint *)(in_RDI + 0x24);
        uVar4 = getEnd1(local_10);
        if (uVar4 < uVar3) {
          mergeAlignmentRecordsSingle
                    (in_stack_fffffffffffffd00,(AlignmentRecord *)in_stack_fffffffffffffcf8.pi_,
                     in_stack_fffffffffffffcf4,iVar2);
          uVar3 = getStart1(local_10);
          *(uint *)(in_RDI + 0x24) = uVar3;
          uVar3 = getEnd1(local_10);
          *(uint *)(in_RDI + 0x28) = uVar3;
          *(undefined1 *)(in_RDI + 0x184) = 0;
          getCigar1(local_10);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff7d0.pi_,
                     (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          getSequence1(local_10);
          ShortDnaSequence::operator=
                    (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
          iVar2 = getPhredSum1(local_10);
          *(int *)(in_RDI + 0x20) = iVar2;
          iVar2 = getLengthInclDeletions1(local_10);
          *(int *)(in_RDI + 0x60) = iVar2;
          iVar2 = getLengthInclLongDeletions1(local_10);
          *(int *)(in_RDI + 100) = iVar2;
          getCigar1Unrolled(local_10);
          std::vector<char,_std::allocator<char>_>::operator=
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff7d0.pi_,
                     (vector<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
          getReferenceSeq1_abi_cxx11_(in_stack_fffffffffffff728);
          pmVar12 = local_3d0;
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),(string *)pmVar12);
          std::__cxx11::string::~string((string *)pmVar12);
          getAlignSequence1_abi_cxx11_(in_stack_fffffffffffff728);
          pmVar12 = &local_3f0;
          std::__cxx11::string::operator=((string *)(in_RDI + 0x220),(string *)pmVar12);
          std::__cxx11::string::~string((string *)pmVar12);
          getQualityList1(in_stack_fffffffffffff728);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff738);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740);
        }
        else if ((int)local_330._0_4_ <
                 (int)local_328.
                      super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_) {
          if ((int)local_330._0_4_ <=
              (int)local_328.
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start._0_4_) {
            while ((int)local_330._0_4_ <
                   (int)local_328.
                        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_) {
              in_stack_fffffffffffff740 = local_354;
              in_stack_fffffffffffff738 = local_338 + 8;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)(local_344 + 8);
              in_stack_fffffffffffff728 = (AlignmentRecord *)(local_34c + 4);
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
              noOverlapMerge(in_stack_fffffffffffff800,
                             (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)
                             ,(string *)in_stack_fffffffffffff7f0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                             ,in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            while (uVar3 = local_330._0_4_, uVar4 = getEnd1(local_10), uVar3 <= uVar4) {
              in_stack_fffffffffffff750._M_current = local_338 + 8;
              in_stack_fffffffffffff748._M_current = local_344 + 8;
              in_stack_fffffffffffff740 = local_338;
              in_stack_fffffffffffff738 = local_34c + 4;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)local_344;
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_2b8;
              in_stack_fffffffffffff7f0 = (AlignmentRecord *)&stack0xfffffffffffff728;
              overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                           (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                           (string *)in_stack_fffffffffffff860.pi_,
                           (AlignmentRecord *)
                           CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                           (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                           (string *)in_stack_fffffffffffff880.pi_,
                           (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                           &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                           in_stack_fffffffffffff8a0,
                           (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                           (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                           (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0)
              ;
            }
            while (uVar11 = local_330._0_4_, uVar5 = getStart2(local_10), (uint)uVar11 < (uint)uVar5
                  ) {
              in_stack_fffffffffffff740 = local_354 + 4;
              in_stack_fffffffffffff738 = local_338 + 8;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)local_338;
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_344;
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
              noOverlapMerge(in_stack_fffffffffffff800,(string *)CONCAT44(uVar4,uVar3),
                             (string *)in_stack_fffffffffffff7f0,(string *)CONCAT44(uVar5,uVar11),
                             in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            local_354._0_4_ = local_354._4_4_;
            qualities_00 = (string *)getCigar2Unrolled(local_10);
            computeSOffset((vector<char,_std::allocator<char>_> *)
                           in_stack_fffffffffffff750._M_current,
                           (int *)in_stack_fffffffffffff748._M_current,
                           (int *)in_stack_fffffffffffff740);
            while (uVar10 = (int)local_330._0_4_ <= (int)local_338._4_4_ &&
                            (int)local_330._0_4_ <= (int)local_330._4_4_,
                  (int)local_330._0_4_ <= (int)local_338._4_4_ &&
                  (int)local_330._0_4_ <= (int)local_330._4_4_) {
              in_stack_fffffffffffff750._M_current = local_338 + 8;
              in_stack_fffffffffffff748._M_current = local_344 + 4;
              in_stack_fffffffffffff740 = local_338;
              in_stack_fffffffffffff738 = local_34c;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)local_344;
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_2b8;
              overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                           (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                           (string *)in_stack_fffffffffffff860.pi_,
                           (AlignmentRecord *)
                           CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                           (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                           (string *)in_stack_fffffffffffff880.pi_,
                           (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                           &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                           in_stack_fffffffffffff8a0,
                           (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                           (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                           (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0)
              ;
            }
            local_354._0_4_ = local_354._4_4_ + -1;
            if (local_330._0_4_ - 1 == local_338._4_4_) {
              while ((int)local_330._0_4_ <= (int)local_330._4_4_) {
                in_stack_fffffffffffff740 = local_354 + 4;
                in_stack_fffffffffffff738 = local_338 + 8;
                in_stack_fffffffffffff730 = (ShortDnaSequence *)local_338;
                in_stack_fffffffffffff728 = (AlignmentRecord *)local_344;
                in_stack_fffffffffffff748._M_current =
                     (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1)
                ;
                noOverlapMerge(in_stack_fffffffffffff800,(string *)CONCAT44(uVar4,uVar3),
                               (string *)in_stack_fffffffffffff7f0,(string *)CONCAT44(uVar5,uVar11),
                               qualities_00,(string *)CONCAT17(uVar10,in_stack_fffffffffffff7d8),
                               (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                               (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                               (int)in_stack_fffffffffffff830);
              }
              updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                              (string *)CONCAT44(uVar5,uVar11),(int)((ulong)qualities_00 >> 0x20),
                              (int)qualities_00);
            }
            else if (local_330._0_4_ - 1 == local_330._4_4_) {
              while ((int)local_330._0_4_ <= (int)local_338._4_4_) {
                in_stack_fffffffffffff740 = local_354;
                in_stack_fffffffffffff738 = local_338 + 8;
                in_stack_fffffffffffff730 = (ShortDnaSequence *)(local_344 + 4);
                in_stack_fffffffffffff728 = (AlignmentRecord *)local_34c;
                in_stack_fffffffffffff748._M_current =
                     (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),2)
                ;
                noOverlapMerge(in_stack_fffffffffffff800,(string *)CONCAT44(uVar4,uVar3),
                               (string *)in_stack_fffffffffffff7f0,(string *)CONCAT44(uVar5,uVar11),
                               qualities_00,(string *)CONCAT17(uVar10,in_stack_fffffffffffff7d8),
                               (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                               (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                               (int)in_stack_fffffffffffff830);
              }
              updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                              (string *)CONCAT44(uVar5,uVar11),(int)((ulong)qualities_00 >> 0x20),
                              (int)qualities_00);
            }
            local_4a4 = getStart1(local_10);
            puVar7 = std::min<unsigned_int>((uint *)(in_RDI + 0x24),&local_4a4);
            *(uint *)(in_RDI + 0x24) = *puVar7;
            local_4a8 = getEnd2(local_10);
            puVar7 = std::max<unsigned_int>(&local_4a8,(uint *)(in_RDI + 0x28));
            *(uint *)(in_RDI + 0x28) = *puVar7;
            *(undefined1 *)(in_RDI + 0x184) = 1;
            createCigar(in_stack_fffffffffffff798);
            std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                      ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                       in_stack_fffffffffffff740,
                       (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                       in_stack_fffffffffffff738);
            std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                      ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                       in_stack_fffffffffffff740);
            ShortDnaSequence::ShortDnaSequence
                      (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810
                      );
            ShortDnaSequence::operator=
                      (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
            ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff730);
            iVar2 = phred_sum((string *)in_stack_fffffffffffff740,
                              (char)((ulong)in_stack_fffffffffffff738 >> 0x38));
            *(int *)(in_RDI + 0x20) = iVar2;
            sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28fbef);
            *(int *)(in_RDI + 0x60) = (int)sVar8;
            sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28fc0f);
            *(int *)(in_RDI + 100) = (int)sVar8;
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)0x28fc2f);
            local_510 = local_2b8;
            local_518._M_current = (char *)std::__cxx11::string::begin();
            std::__cxx11::string::end();
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffff730,
                                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)in_stack_fffffffffffff728), bVar1) {
              __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_518);
              std::vector<char,_std::allocator<char>_>::push_back
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff740,
                         (value_type *)in_stack_fffffffffffff738);
              __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_518);
            }
            std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),local_2e0);
            std::__cxx11::string::operator=
                      ((string *)(in_RDI + 0x220),(string *)&stack0xfffffffffffffcf8);
            std::__cxx11::string::begin();
            std::__cxx11::string::end();
            std::vector<int,std::allocator<int>>::
            assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                       in_stack_fffffffffffff750,in_stack_fffffffffffff748);
          }
        }
        else {
          while ((int)local_328.
                      super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ < (int)local_330._0_4_) {
            in_stack_fffffffffffff740 = local_354 + 4;
            in_stack_fffffffffffff738 = (long)local_330 + 8;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_338;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_344;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          while (uVar11 = local_328.
                          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_4_, uVar3 = getEnd1(local_10),
                (uint)uVar11 <= uVar3) {
            in_stack_fffffffffffff750._M_current = (char *)((long)local_330 + 8);
            in_stack_fffffffffffff748._M_current = local_344 + 8;
            in_stack_fffffffffffff740 = local_338;
            in_stack_fffffffffffff738 = local_34c + 4;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_344;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_2b8;
            in_stack_fffffffffffff880.pi_ = (sp_counted_base *)&stack0xfffffffffffff728;
            overlapMerge((AlignmentRecord *)in_stack_fffffffffffff870.pi_,
                         (string *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                         (string *)in_stack_fffffffffffff860.pi_,
                         (AlignmentRecord *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                         (string *)&stack0xfffffffffffff728,(int *)CONCAT44(uVar3,uVar11),
                         &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                         in_stack_fffffffffffff8a0,
                         (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                         (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                         (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
          }
          while (uVar5 = local_328.
                         super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_, uVar4 = getStart2(local_10)
                , (uint)uVar5 < uVar4) {
            in_stack_fffffffffffff740 = local_354 + 4;
            in_stack_fffffffffffff738 = (long)local_330 + 8;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_338;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_344;
            in_stack_fffffffffffff748._M_current =
                 (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
            noOverlapMerge(in_stack_fffffffffffff800,
                           (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                           (string *)in_stack_fffffffffffff7f0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                           in_stack_fffffffffffff7e0,
                           (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                           (int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                           (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                           (int)in_stack_fffffffffffff830);
          }
          local_354._0_4_ = local_354._4_4_;
          sVar6.pi_ = (sp_counted_base *)getCigar2Unrolled(local_10);
          computeSOffset((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff750._M_current
                         ,(int *)in_stack_fffffffffffff748._M_current,
                         (int *)in_stack_fffffffffffff740);
          while ((int)local_328.
                      super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ <= (int)local_338._4_4_ &&
                 (int)local_328.
                      super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ <= (int)local_330._4_4_) {
            in_stack_fffffffffffff750._M_current = (char *)((long)local_330 + 8);
            in_stack_fffffffffffff748._M_current = local_344 + 4;
            in_stack_fffffffffffff740 = local_338;
            in_stack_fffffffffffff738 = local_34c;
            in_stack_fffffffffffff730 = (ShortDnaSequence *)local_344;
            in_stack_fffffffffffff728 = (AlignmentRecord *)local_2b8;
            overlapMerge((AlignmentRecord *)sVar6.pi_,
                         (string *)
                         CONCAT17((int)local_328.
                                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_ <=
                                  (int)local_338._4_4_ &&
                                  (int)local_328.
                                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_ <=
                                  (int)local_330._4_4_,in_stack_fffffffffffff868),
                         (string *)&stack0xfffffffffffff728,
                         (AlignmentRecord *)
                         CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                         (string *)in_stack_fffffffffffff850.pi_,in_stack_fffffffffffff848,
                         (string *)in_stack_fffffffffffff880.pi_,(int *)CONCAT44(uVar3,uVar11),
                         &in_stack_fffffffffffff890->ref,&in_stack_fffffffffffff898->ref,
                         in_stack_fffffffffffff8a0,
                         (int *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                         (int *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                         (_Rb_tree_color)in_stack_fffffffffffff8b8,(int)in_stack_fffffffffffff8c0);
          }
          local_354._0_4_ = local_354._4_4_ - local_354._0_4_;
          if (local_328.super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ - 1 == local_338._4_4_) {
            while ((int)local_328.
                        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_ <= (int)local_330._4_4_) {
              in_stack_fffffffffffff740 = local_354 + 4;
              in_stack_fffffffffffff738 = (long)local_330 + 8;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)local_338;
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_344;
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),1);
              noOverlapMerge(in_stack_fffffffffffff800,
                             (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)
                             ,(string *)in_stack_fffffffffffff7f0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                             ,in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                            (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                            (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                            (int)in_stack_fffffffffffff7e0);
          }
          else if (local_328.
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start._0_4_ - 1 == local_330._4_4_) {
            while ((int)local_328.
                        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_ <= (int)local_338._4_4_) {
              in_stack_fffffffffffff740 = local_354;
              in_stack_fffffffffffff738 = (long)local_330 + 8;
              in_stack_fffffffffffff730 = (ShortDnaSequence *)(local_344 + 4);
              in_stack_fffffffffffff728 = (AlignmentRecord *)local_34c;
              in_stack_fffffffffffff748._M_current =
                   (char *)CONCAT44((uint)((ulong)in_stack_fffffffffffff748._M_current >> 0x20),2);
              noOverlapMerge(in_stack_fffffffffffff800,
                             (string *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8)
                             ,(string *)in_stack_fffffffffffff7f0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                             ,in_stack_fffffffffffff7e0,
                             (string *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8)
                             ,(int *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff818,
                             (int *)in_stack_fffffffffffff820,in_stack_fffffffffffff828,
                             (int)in_stack_fffffffffffff830);
            }
            updateReference((AlignmentRecord *)in_stack_fffffffffffff7f0,
                            (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                            (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                            (int)in_stack_fffffffffffff7e0);
          }
          sVar6.pi_ = (sp_counted_base *)(in_RDI + 0x24);
          local_40c[0] = getStart1(local_10);
          puVar7 = std::min<unsigned_int>((uint *)sVar6.pi_,local_40c);
          *(uint *)(in_RDI + 0x24) = *puVar7;
          local_410 = getEnd2(local_10);
          puVar7 = std::max<unsigned_int>(&local_410,(uint *)(in_RDI + 0x28));
          *(uint *)(in_RDI + 0x28) = *puVar7;
          *(undefined1 *)(in_RDI + 0x184) = 1;
          createCigar(in_stack_fffffffffffff798);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff740,
                     (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff738);
          std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::~vector
                    ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                     in_stack_fffffffffffff740);
          ShortDnaSequence::ShortDnaSequence
                    (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810);
          ShortDnaSequence::operator=
                    (in_stack_fffffffffffff730,(ShortDnaSequence *)in_stack_fffffffffffff728);
          ShortDnaSequence::~ShortDnaSequence(in_stack_fffffffffffff730);
          iVar2 = phred_sum((string *)in_stack_fffffffffffff740,
                            (char)((ulong)in_stack_fffffffffffff738 >> 0x38));
          *(int *)(in_RDI + 0x20) = iVar2;
          sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28f3ee);
          *(int *)(in_RDI + 0x60) = (int)sVar8;
          sVar8 = ShortDnaSequence::size((ShortDnaSequence *)0x28f414);
          *(int *)(in_RDI + 100) = (int)sVar8;
          std::vector<char,_std::allocator<char>_>::clear
                    ((vector<char,_std::allocator<char>_> *)0x28f43a);
          local_478 = local_2b8;
          local_480._M_current = (char *)std::__cxx11::string::begin();
          local_488 = std::__cxx11::string::end();
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffff730,
                                    (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)in_stack_fffffffffffff728), bVar1) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_480);
            local_489 = *pcVar9;
            std::vector<char,_std::allocator<char>_>::push_back
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff740,
                       (value_type *)in_stack_fffffffffffff738);
            __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_480);
          }
          std::__cxx11::string::operator=((string *)(in_RDI + 0x1e0),local_2e0);
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x220),(string *)&stack0xfffffffffffffcf8);
          local_498 = std::__cxx11::string::begin();
          local_4a0 = std::__cxx11::string::end();
          std::vector<int,std::allocator<int>>::
          assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740,
                     in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        }
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf8);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)(local_2b8 + 0x20));
      std::__cxx11::string::~string(local_278);
    }
  }
  return;
}

Assistant:

void AlignmentRecord::mergeAlignmentRecordsMixed(const AlignmentRecord& ar){
    if(ar.isSingleEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        offset_s_f = computeOffset(ar.getCigar1Unrolled());
        offset_s_b = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_f1 = computeOffset(this->cigar1_unrolled);
        offset_p_f2 = computeOffset(this->cigar2_unrolled);
        offset_p_b1 = computeRevOffset(this->cigar1_unrolled);
        offset_p_b2 = computeRevOffset(this->cigar2_unrolled);
        int ref_s_pos1 = ar.getStart1()-offset_s_f;
        int ref_e_pos1 = ar.getEnd1()+offset_s_b;
        int ref_p_s_pos1 = this->start1-offset_p_f1;
        int ref_p_e_pos1 = this->end1+offset_p_b1;
        int ref_p_s_pos2 = this->start2-offset_p_f2;
        int ref_p_e_pos2 = this->end2+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        //int i;
        // ---------     -------- ->this (second read not changed)
        //----------
        if(ar.getEnd1() < this->start2){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->single_end = false;
            assert(this->end1 < this->start2);
        } // -------     -------- ->this (second read not changed)
        //             ----------
        else if (ar.getStart1() > this->end1){
            mergeAlignmentRecordsSingle(ar,2,1);
            assert(this->end1 < this->start2);
        } //----------          -----------   ->this OR  -------       -----------
        //-------------------------------              -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
            while(ref_s_pos1<ref_p_s_pos1){
                ar.noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            while(ref_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            while(ref_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1;
            if(ref_s_pos1-1 == ref_p_e_pos2){
                while(ref_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_s_pos1-1 == ref_e_pos1){
                while(ref_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        } //----------          ------------ ->this OR ----------       -----------
        //     -------------------------------            ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            while(ref_p_s_pos1<=this->end1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos1,c_pos1,q_p_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }
            ref_rel_pos2 = ref_rel_pos1 - ref_rel_pos2 ;
            while(ref_p_s_pos1<this->start2){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            ref_rel_pos1 = 0;
            computeSOffset(this->cigar2_unrolled,c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_p_pos2,c_pos1,q_p_pos2,q_pos1,ref_p_s_pos1,ref_rel_pos1,2,1);
            }
            ref_rel_pos2 += ref_rel_pos1-1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos2,1);
                }
                ar.updateReference(ref,1,ref_rel_pos2);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,2);
                }
                updateReference(ref,2,ref_rel_pos1);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd1(),this->end2);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(),qualities.end());
        }
    }
    else if (ar.isPairedEnd()){
        std::string dna, qualities, nucigar = "";
        std::string ref = "";
        std::string algn = "";
        int offset_s_f, offset_s_b, offset_p_f1, offset_p_f2, offset_p_b1, offset_p_b2 = 0;
        //get starting position and ending position according to ref position, paying attention to clipped bases
        //updated ref position including clips
        offset_s_f = computeOffset(this->cigar1_unrolled);
        offset_s_b = computeRevOffset(this->cigar1_unrolled);
        offset_p_f1 = computeOffset(ar.getCigar1Unrolled());
        offset_p_f2 = computeOffset(ar.getCigar2Unrolled());
        offset_p_b1 = computeRevOffset(ar.getCigar1Unrolled());
        offset_p_b2 = computeRevOffset(ar.getCigar2Unrolled());
        int ref_s_pos1 = this->start1-offset_s_f;
        int ref_e_pos1 = this->end1+offset_s_b;
        int ref_p_s_pos1 = ar.getStart1()-offset_p_f1;
        //int ref_p_e_pos1 = ar.getEnd1()+offset_p_b1;
        //int ref_p_s_pos2 = ar.getStart2()-offset_p_f2;
        int ref_p_e_pos2 = ar.getEnd2()+offset_p_b2;
        //position in query sequences // phred scores
        int q_pos1 = 0;
        int q_p_pos1 = 0;
        int q_p_pos2 = 0;
        //position in unrolled cigar vectors
        int c_pos1 = 0;
        int c_p_pos1 = 0;
        int c_p_pos2 = 0;
        //Position in the reference strings
        int ref_rel_pos1 =0;
        int ref_rel_pos2 =0;
        // ---------  -----------          OR ---------- ------------
        // ---------               ->this                -------------
        if(this->end1 < ar.getStart2()){
            mergeAlignmentRecordsSingle(ar,1,1);
            this->start2 = ar.getStart2();
            this->end2=ar.getEnd2();
            this->single_end= false;
            this->cigar2 = ar.getCigar2();
            this->sequence2=ar.getSequence2();
            this->phred_sum2=ar.getPhredSum2();
            this->length_incl_deletions2 = ar.getLengthInclDeletions2();
            this->length_incl_longdeletions2 = ar.getLengthInclLongDeletions2();
            this->cigar2_unrolled = ar.getCigar2Unrolled();
            this->reference_seq2 = ar.getReferenceSeq2();
            this->alignSequence2 = ar.getAlignSequence2();
            this->qualityList2 = ar.getQualityList2();
        } else if (this->start1 > ar.getEnd1()){
            mergeAlignmentRecordsSingle(ar,1,2);
            this->start1= ar.getStart1();
            this->end1=ar.getEnd1();
            this->single_end= false;
            this->cigar1 = ar.getCigar1();
            this->sequence1=ar.getSequence1();
            this->phred_sum1=ar.getPhredSum1();
            this->length_incl_deletions1 = ar.getLengthInclDeletions1();
            this->length_incl_longdeletions1 = ar.getLengthInclLongDeletions1();
            this->cigar1_unrolled = ar.getCigar1Unrolled();
            this->reference_seq1 = ar.getReferenceSeq1();
            this->alignSequence1 = ar.getAlignSequence1();
            this->qualityList1 = ar.getQualityList1();
        }//----------          -----------        OR  -------       -----------
        //----------------------------    <-this    -----------------------------
        else if(ref_s_pos1 <= ref_p_s_pos1){
                while(ref_s_pos1<ref_p_s_pos1){
                    noOverlapMerge(algn,ref,dna, qualities, nucigar, c_pos1, q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                while(ref_s_pos1<=ar.getEnd1()){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_s_pos1,ref_rel_pos1,1,1);
                }
                while(ref_s_pos1<ar.getStart2()){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                }
                ref_rel_pos2 = ref_rel_pos1;
                computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);

                while(ref_s_pos1<=ref_p_e_pos2 && ref_s_pos1 <=ref_e_pos1){
                    overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_s_pos1,ref_rel_pos1,1,2);
                }
                ref_rel_pos2 = ref_rel_pos1 -ref_rel_pos2;
                if(ref_s_pos1-1 == ref_p_e_pos2){
                    while(ref_s_pos1<=ref_e_pos1){
                        noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_s_pos1,ref_rel_pos1,1);
                    }
                    updateReference(ref,1,ref_rel_pos1);
                } else if (ref_s_pos1-1 == ref_e_pos1){
                    while(ref_s_pos1<=ref_p_e_pos2){
                        ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_s_pos1,ref_rel_pos2,2);
                    }
                    ar.updateReference(ref,2,ref_rel_pos2);
                }
                this->start1=std::min(this->start1,ar.getStart1());
                this->end1=std::max(ar.getEnd2(),this->end1);
                this->single_end = true;
                this->cigar1=createCigar(nucigar);
                this->sequence1=ShortDnaSequence(dna,qualities);
                this->phred_sum1=phred_sum(qualities);
                this->length_incl_deletions1 = this->sequence1.size();
                this->length_incl_longdeletions1 = this->sequence1.size();
                this->cigar1_unrolled.clear();
                for (char i : nucigar){
                    this->cigar1_unrolled.push_back(i);
                }
                this->reference_seq1 = ref;
                this->alignSequence1 = algn;
                this->qualityList1.assign(qualities.begin(), qualities.end());

        }//----------          ------------        OR ----------       -----------
        //     -------------------------------   <-this   ----------------------
        else if(ref_s_pos1 >= ref_p_s_pos1){
            while(ref_p_s_pos1 < ref_s_pos1){
                ar.noOverlapMerge(algn,ref,dna,qualities,nucigar, c_p_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos2,1);
            }
            while(ref_p_s_pos1<=ar.getEnd1()){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos1,q_pos1,q_p_pos1,ref_p_s_pos1,ref_rel_pos1,1,1);
            }

            while(ref_p_s_pos1<ar.getStart2()){
                noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
            }
            ref_rel_pos2 = ref_rel_pos1;
            computeSOffset(ar.getCigar2Unrolled(),c_p_pos2,q_p_pos2);
            while(ref_p_s_pos1<=ref_p_e_pos2 && ref_p_s_pos1 <= ref_e_pos1){
                overlapMerge(algn,ref,ar,dna,qualities,nucigar,c_pos1,c_p_pos2,q_pos1,q_p_pos2,ref_p_s_pos1,ref_rel_pos1,1,2);
            }
            ref_rel_pos2 = ref_rel_pos1 -1;
            if(ref_p_s_pos1-1 == ref_p_e_pos2){
                while(ref_p_s_pos1<=ref_e_pos1){
                    noOverlapMerge(algn,ref,dna,qualities,nucigar,c_pos1,q_pos1,ref_p_s_pos1,ref_rel_pos1,1);
                }
                updateReference(ref,1,ref_rel_pos1);
            } else if (ref_p_s_pos1-1 == ref_e_pos1){
                while(ref_p_s_pos1<=ref_p_e_pos2){
                    ar.noOverlapMerge(algn,ref,dna,qualities,nucigar,c_p_pos2,q_p_pos2,ref_p_s_pos1,ref_rel_pos2,2);
                }
                ar.updateReference(ref,2,ref_rel_pos2);
            }
            this->start1=std::min(this->start1,ar.getStart1());
            this->end1=std::max(ar.getEnd2(),this->end1);
            this->single_end = true;
            this->cigar1=createCigar(nucigar);
            this->sequence1=ShortDnaSequence(dna,qualities);
            this->phred_sum1=phred_sum(qualities);
            this->length_incl_deletions1 = this->sequence1.size();
            this->length_incl_longdeletions1 = this->sequence1.size();
            this->cigar1_unrolled.clear();
            for (char i : nucigar){
                this->cigar1_unrolled.push_back(i);
            }
            this->reference_seq1 = ref;
            this->alignSequence1 = algn;
            this->qualityList1.assign(qualities.begin(), qualities.end());
        }
    }
}